

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_array.c
# Opt level: O3

void * find_in_curious_dynamic_array
                 (curious_dynamic_array_t *self,void *value,compare_f compare_to_el)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  
  if (-1 < self->last_el) {
    lVar3 = -1;
    do {
      lVar3 = lVar3 + 1;
      pvVar2 = (void *)(self->el_size * lVar3 + (long)self->array);
      iVar1 = (*compare_to_el)(value,pvVar2);
      if (iVar1 == 0) {
        return pvVar2;
      }
    } while (lVar3 < self->last_el);
  }
  return (void *)0x0;
}

Assistant:

void* find_in_curious_dynamic_array(curious_dynamic_array_t* self, void* value, compare_f compare_to_el)
{
    for (int i = 0; i <= self->last_el; ++i) {
        void* el = get_from_curious_dynamic_array(self, i);

        if (0 == compare_to_el(value, el)) {
            return el;
        }
    }

    return NULL;
}